

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type_cast.c
# Opt level: O3

value value_type_cast(value v,type_id id)

{
  type_id tVar1;
  int iVar2;
  void *data_00;
  size_t sVar3;
  value pvVar4;
  undefined8 *puVar5;
  size_t bytes;
  value pvVar6;
  type_id in_ESI;
  value in_RDI;
  int64_t data;
  type_id in_stack_ffffffffffffffbc;
  type_id local_3c;
  value in_stack_ffffffffffffffc8;
  long lVar7;
  value local_30;
  
  local_3c = in_ESI;
  local_30 = in_RDI;
  tVar1 = value_type_id(in_RDI);
  iVar2 = type_id_invalid(tVar1);
  if ((iVar2 != 0) && (iVar2 = type_id_invalid(in_ESI), iVar2 != 0)) {
    if (tVar1 == in_ESI) {
      return in_RDI;
    }
    iVar2 = type_id_string(tVar1);
    if (iVar2 == 0) {
      return (value)0x0;
    }
    iVar2 = type_id_string(in_ESI);
    if (iVar2 == 0) {
      return (value)0x0;
    }
    iVar2 = type_id_null(tVar1);
    if (iVar2 == 0) {
      iVar2 = type_id_boolean(in_ESI);
      if (iVar2 != 0) {
        type_id_array(in_ESI);
        return in_RDI;
      }
      return in_RDI;
    }
    iVar2 = type_id_null(in_ESI);
    if (iVar2 == 0) {
      pvVar4 = value_create_null();
    }
    else {
      iVar2 = type_id_buffer(in_ESI);
      if ((7 < tVar1) || (iVar2 != 0)) {
        iVar2 = type_id_array(in_ESI);
        if ((tVar1 < 8) && (iVar2 == 0)) {
          pvVar4 = value_type_create(&local_30,8,9);
          if (pvVar4 == (value)0x0) {
            return (value)0x0;
          }
          value_type_destroy(local_30);
          return pvVar4;
        }
        iVar2 = type_id_array(tVar1);
        if ((7 < in_ESI || iVar2 != 0) || (sVar3 = value_type_size(in_RDI), sVar3 != 8)) {
          sVar3 = value_type_id_size(tVar1);
          bytes = value_type_id_size(in_ESI);
          if (tVar1 < in_ESI) {
            iVar2 = type_id_integer(tVar1);
            if ((iVar2 == 0) && (iVar2 = type_id_integer(in_ESI), iVar2 == 0)) {
              pvVar4 = value_type_promotion_integer(in_RDI,in_ESI);
              return pvVar4;
            }
            iVar2 = type_id_decimal(tVar1);
            if ((iVar2 == 0) && (iVar2 = type_id_decimal(in_ESI), iVar2 == 0)) {
              pvVar4 = value_type_promotion_decimal(in_RDI,in_ESI);
              return pvVar4;
            }
            iVar2 = type_id_integer(tVar1);
            if (iVar2 != 0) {
              return (value)0x0;
            }
            iVar2 = type_id_decimal(in_ESI);
            if (iVar2 != 0) {
              return (value)0x0;
            }
            lVar7 = 0;
            value_to(in_RDI,&stack0xffffffffffffffc8,sVar3);
            if (sVar3 == bytes) {
              value_from((value)(sVar3 + (long)in_RDI),&local_3c,4);
              pvVar4 = in_RDI;
            }
            else {
              pvVar6 = value_type_create((void *)0x0,bytes,local_3c);
              pvVar4 = (value)0x0;
              if (pvVar6 != (value)0x0) {
                value_type_destroy(in_RDI);
                pvVar4 = pvVar6;
              }
            }
            if (local_3c != 6) {
              if (local_3c != 5) {
                return (value)0x0;
              }
              pvVar4 = value_from_float(pvVar4,(float)lVar7);
              return pvVar4;
            }
            pvVar4 = value_from_double(pvVar4,(double)lVar7);
            return pvVar4;
          }
          if (tVar1 <= in_ESI) {
            return (value)0x0;
          }
          iVar2 = type_id_boolean(in_ESI);
          if (iVar2 == 0) {
            pvVar4 = value_type_demotion_boolean(in_RDI,in_ESI);
            return pvVar4;
          }
          iVar2 = type_id_integer(tVar1);
          if ((iVar2 == 0) && (iVar2 = type_id_integer(in_ESI), iVar2 == 0)) {
            pvVar4 = value_type_demotion_integer(in_RDI,in_ESI);
            return pvVar4;
          }
          iVar2 = type_id_decimal(tVar1);
          if ((iVar2 == 0) && (iVar2 = type_id_decimal(in_ESI), iVar2 == 0)) {
            pvVar4 = value_type_demotion_decimal(in_RDI,in_ESI);
            return pvVar4;
          }
          iVar2 = type_id_decimal(tVar1);
          if (iVar2 != 0) {
            return (value)0x0;
          }
          iVar2 = type_id_integer(in_ESI);
          if (iVar2 != 0) {
            return (value)0x0;
          }
          if (tVar1 == 6) {
            value_to_double(in_RDI);
          }
          else {
            if (tVar1 != 5) {
              return (value)0x0;
            }
            value_to_float(in_RDI);
          }
          if (sVar3 == bytes) {
            value_from((value)(sVar3 + (long)in_RDI),&local_3c,4);
            pvVar4 = in_RDI;
          }
          else {
            pvVar6 = value_type_create((void *)0x0,bytes,in_ESI);
            pvVar4 = (value)0x0;
            if (pvVar6 != (value)0x0) {
              value_type_destroy(in_RDI);
              pvVar4 = pvVar6;
            }
          }
          pvVar4 = value_from(pvVar4,&stack0xffffffffffffffc8,bytes);
          return pvVar4;
        }
        puVar5 = (undefined8 *)value_data(in_RDI);
        pvVar4 = (value)*puVar5;
        if (pvVar4 == (value)0x0) {
          return (value)0x0;
        }
        tVar1 = value_type_id(pvVar4);
        if (((tVar1 != in_ESI) && (tVar1 = value_type_id(pvVar4), tVar1 < 8)) &&
           (pvVar4 = value_type_cast(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffbc),
           pvVar4 == (value)0x0)) {
          return (value)0x0;
        }
        goto LAB_001200c7;
      }
      data_00 = value_data(in_RDI);
      sVar3 = value_type_id_size(tVar1);
      pvVar4 = value_type_create(data_00,sVar3,8);
    }
    if (pvVar4 != (value)0x0) {
LAB_001200c7:
      value_type_destroy(in_RDI);
      return pvVar4;
    }
  }
  return (value)0x0;
}

Assistant:

value value_type_cast(value v, type_id id)
{
	type_id src_id = value_type_id(v);

	size_t src_size, dest_size;

	/* Invalid source value type */
	if (type_id_invalid(src_id) == 0 || type_id_invalid(id) == 0)
	{
		return NULL;
	}

	/* Equal types, avoid casting */
	if (src_id == id)
	{
		return v;
	}

	/* Cast from string to any type */
	if (type_id_string(src_id) == 0)
	{
		/*return value_type_parse(v, id);*/

		return NULL;
	}

	/* Cast from any type to string */
	if (type_id_string(id) == 0)
	{
		/*return value_type_stringify(v);*/

		return NULL;
	}

	/* TODO: Cast from null value */
	if (type_id_null(src_id) == 0)
	{
		if (type_id_boolean(id) == 0)
		{
			/* TODO: Create boolean set to false */
			/*
			return value_type_create_bool
			*/
		}
		/*
		...
		*/
		else if (type_id_array(id) == 0)
		{
			/* TODO: Create an empty array */
			/*
			return value_type_create_bool
			*/
		}

		return v;
	}

	/* Cast to null value  */
	if (type_id_null(id) == 0)
	{
		value dest = value_create_null();

		if (dest == NULL)
		{
			return NULL;
		}

		value_type_destroy(v);

		return dest;
	}

	/* Convert single value to buffer */
	if (type_id_buffer(id) == 0 && src_id < TYPE_BUFFER)
	{
		value dest = value_type_create(value_data(v), value_type_id_size(src_id), TYPE_BUFFER);

		if (dest == NULL)
		{
			return NULL;
		}

		value_type_destroy(v);

		return dest;
	}

	/* TODO: Convert buffer to array */

	/* TODO: Convert buffer of size 1 to a single type */

	/* Convert single value to array */
	if (type_id_array(id) == 0 && src_id < TYPE_BUFFER)
	{
		value dest = value_type_create(&v, sizeof(value), TYPE_ARRAY);

		if (dest == NULL)
		{
			return NULL;
		}

		value_type_destroy(v);

		return dest;
	}

	/* TODO: Convert array to buffer */

	/* Convert array of size 1 to a single type */
	if (type_id_array(src_id) == 0 && id < TYPE_BUFFER && value_type_size(v) == sizeof(value))
	{
		value *values = value_data(v);

		value dest = values[0];

		if (dest == NULL)
		{
			return NULL;
		}

		if (value_type_id(dest) != id && value_type_id(dest) < TYPE_BUFFER)
		{
			value cast = value_type_cast(dest, id);

			if (cast == NULL)
			{
				return NULL;
			}

			dest = cast;
		}

		value_type_destroy(v);

		return dest;
	}

	/* TODO: Map */

	src_size = value_type_id_size(src_id);

	dest_size = value_type_id_size(id);

	/* Promote value type */
	if (src_id < id)
	{
		if (type_id_integer(src_id) == 0 && type_id_integer(id) == 0)
		{
			return value_type_promotion_integer(v, id);
		}

		if (type_id_decimal(src_id) == 0 && type_id_decimal(id) == 0)
		{
			return value_type_promotion_decimal(v, id);
		}

		if (type_id_integer(src_id) == 0 && type_id_decimal(id) == 0)
		{
			value dest = NULL;

			int64_t data = 0L;

			value_to(v, &data, src_size);

			if (src_size == dest_size)
			{
				value_from((value)(((uintptr_t)v) + src_size), &id, sizeof(type_id));

				dest = v;
			}
			else
			{
				dest = value_type_create(NULL, dest_size, id);

				if (dest != NULL)
				{
					value_type_destroy(v);
				}
			}

			if (id == TYPE_FLOAT)
			{
				float f = (float)data;

				return value_from_float(dest, f);
			}
			else if (id == TYPE_DOUBLE)
			{
				double d = (double)data;

				return value_from_double(dest, d);
			}

			return NULL;
		}

		return NULL;
	}

	/* Demote value type */
	if (src_id > id)
	{
		if (type_id_boolean(id) == 0)
		{
			return value_type_demotion_boolean(v, id);
		}

		if (type_id_integer(src_id) == 0 && type_id_integer(id) == 0)
		{
			return value_type_demotion_integer(v, id);
		}

		if (type_id_decimal(src_id) == 0 && type_id_decimal(id) == 0)
		{
			return value_type_demotion_decimal(v, id);
		}

		if (type_id_decimal(src_id) == 0 && type_id_integer(id) == 0)
		{
			value dest = NULL;

			int64_t data = 0L;

			if (src_id == TYPE_FLOAT)
			{
				data = (int64_t)value_to_float(v);
			}
			else if (src_id == TYPE_DOUBLE)
			{
				data = (int64_t)value_to_double(v);
			}
			else
			{
				return NULL;
			}

			if (src_size == dest_size)
			{
				value_from((value)(((uintptr_t)v) + src_size), &id, sizeof(type_id));

				dest = v;
			}
			else
			{
				dest = value_type_create(NULL, dest_size, id);

				if (dest != NULL)
				{
					value_type_destroy(v);
				}
			}

			return value_from(dest, &data, dest_size);
		}

		return NULL;
	}

	return NULL;
}